

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmaster.c
# Opt level: O2

void jpeg_calc_output_dimensions(j_decompress_ptr cinfo)

{
  jpeg_error_mgr *pjVar1;
  jpeg_component_info *pjVar2;
  uint uVar3;
  boolean bVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  jpeg_component_info *pjVar9;
  int iVar10;
  int iVar11;
  JDIMENSION *pJVar12;
  int iVar13;
  int iVar14;
  
  iVar6 = cinfo->global_state;
  if (iVar6 != 0xca) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x15;
    (pjVar1->msg_parm).i[0] = iVar6;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  jpeg_core_output_dimensions(cinfo);
  pjVar2 = cinfo->comp_info;
  iVar6 = cinfo->num_components;
  iVar8 = 0;
  pjVar9 = pjVar2;
  iVar7 = 0;
  if (0 < iVar6) {
    iVar7 = iVar6;
  }
  do {
    if (iVar8 == iVar7) {
      pJVar12 = &pjVar2->downsampled_height;
      for (iVar7 = 0; iVar7 < iVar6; iVar7 = iVar7 + 1) {
        lVar5 = jdiv_round_up((long)(int)pJVar12[-3] * (long)(int)pJVar12[-10] *
                              (ulong)cinfo->image_width,
                              (long)cinfo->block_size * (long)cinfo->max_h_samp_factor);
        pJVar12[-1] = (JDIMENSION)lVar5;
        lVar5 = jdiv_round_up((long)(int)pJVar12[-2] * (long)(int)pJVar12[-9] *
                              (ulong)cinfo->image_height,
                              (long)cinfo->block_size * (long)cinfo->max_v_samp_factor);
        *pJVar12 = (JDIMENSION)lVar5;
        iVar6 = cinfo->num_components;
        pJVar12 = pJVar12 + 0x18;
      }
      uVar3 = cinfo->out_color_space - JCS_GRAYSCALE;
      if (uVar3 < 5) {
        iVar6 = *(int *)(&DAT_002c7fac + (ulong)uVar3 * 4);
      }
      cinfo->out_color_components = iVar6;
      iVar7 = 1;
      if (cinfo->quantize_colors != 0) {
        iVar6 = iVar7;
      }
      cinfo->output_components = iVar6;
      bVar4 = use_merged_upsample(cinfo);
      if (bVar4 != 0) {
        iVar7 = cinfo->max_v_samp_factor;
      }
      cinfo->rec_outbuf_height = iVar7;
      return;
    }
    iVar11 = (uint)(cinfo->do_fancy_upsampling != 0) * 4 + 4;
    iVar13 = 1;
    do {
      iVar10 = cinfo->min_DCT_h_scaled_size * iVar13;
      if (iVar11 < iVar10) break;
      iVar13 = iVar13 * 2;
    } while (cinfo->max_h_samp_factor % (pjVar9->h_samp_factor * iVar13) == 0);
    pjVar9->DCT_h_scaled_size = iVar10;
    iVar13 = 1;
    do {
      iVar14 = cinfo->min_DCT_v_scaled_size * iVar13;
      if (iVar11 < iVar14) break;
      iVar13 = iVar13 * 2;
    } while (cinfo->max_v_samp_factor % (pjVar9->v_samp_factor * iVar13) == 0);
    pjVar9->DCT_v_scaled_size = iVar14;
    iVar13 = iVar14 * 2;
    if (iVar10 == iVar13 || SBORROW4(iVar10,iVar13) != iVar10 + iVar14 * -2 < 0) {
      if (iVar10 * 2 < iVar14) {
        pjVar9->DCT_v_scaled_size = iVar10 * 2;
      }
    }
    else {
      pjVar9->DCT_h_scaled_size = iVar13;
    }
    iVar8 = iVar8 + 1;
    pjVar9 = pjVar9 + 1;
  } while( true );
}

Assistant:

GLOBAL(void)
jpeg_calc_output_dimensions (j_decompress_ptr cinfo)
/* Do computations that are needed before master selection phase.
 * This function is used for full decompression.
 */
{
#ifdef IDCT_SCALING_SUPPORTED
  int ci;
  jpeg_component_info *compptr;
#endif

  /* Prevent application from calling me at wrong times */
  if (cinfo->global_state != DSTATE_READY)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  /* Compute core output image dimensions and DCT scaling choices. */
  jpeg_core_output_dimensions(cinfo);

#ifdef IDCT_SCALING_SUPPORTED

  /* In selecting the actual DCT scaling for each component, we try to
   * scale up the chroma components via IDCT scaling rather than upsampling.
   * This saves time if the upsampler gets to use 1:1 scaling.
   * Note this code adapts subsampling ratios which are powers of 2.
   */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    int ssize = 1;
    while (cinfo->min_DCT_h_scaled_size * ssize <=
	   (cinfo->do_fancy_upsampling ? DCTSIZE : DCTSIZE / 2) &&
	   (cinfo->max_h_samp_factor % (compptr->h_samp_factor * ssize * 2)) == 0) {
      ssize = ssize * 2;
    }
    compptr->DCT_h_scaled_size = cinfo->min_DCT_h_scaled_size * ssize;
    ssize = 1;
    while (cinfo->min_DCT_v_scaled_size * ssize <=
	   (cinfo->do_fancy_upsampling ? DCTSIZE : DCTSIZE / 2) &&
	   (cinfo->max_v_samp_factor % (compptr->v_samp_factor * ssize * 2)) == 0) {
      ssize = ssize * 2;
    }
    compptr->DCT_v_scaled_size = cinfo->min_DCT_v_scaled_size * ssize;

    /* We don't support IDCT ratios larger than 2. */
    if (compptr->DCT_h_scaled_size > compptr->DCT_v_scaled_size * 2)
	compptr->DCT_h_scaled_size = compptr->DCT_v_scaled_size * 2;
    else if (compptr->DCT_v_scaled_size > compptr->DCT_h_scaled_size * 2)
	compptr->DCT_v_scaled_size = compptr->DCT_h_scaled_size * 2;
  }

  /* Recompute downsampled dimensions of components;
   * application needs to know these if using raw downsampled data.
   */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Size in samples, after IDCT scaling */
    compptr->downsampled_width = (JDIMENSION)
      jdiv_round_up((long) cinfo->image_width *
		    (long) (compptr->h_samp_factor * compptr->DCT_h_scaled_size),
		    (long) (cinfo->max_h_samp_factor * cinfo->block_size));
    compptr->downsampled_height = (JDIMENSION)
      jdiv_round_up((long) cinfo->image_height *
		    (long) (compptr->v_samp_factor * compptr->DCT_v_scaled_size),
		    (long) (cinfo->max_v_samp_factor * cinfo->block_size));
  }

#endif /* IDCT_SCALING_SUPPORTED */

  /* Report number of components in selected colorspace. */
  /* Probably this should be in the color conversion module... */
  switch (cinfo->out_color_space) {
  case JCS_GRAYSCALE:
    cinfo->out_color_components = 1;
    break;
  case JCS_RGB:
    cinfo->out_color_components = RGB_PIXELSIZE;
    break;
  case JCS_YCbCr:
    cinfo->out_color_components = 3;
    break;
  case JCS_CMYK:
  case JCS_YCCK:
    cinfo->out_color_components = 4;
    break;
  default:			/* else must be same colorspace as in file */
    cinfo->out_color_components = cinfo->num_components;
    break;
  }
  cinfo->output_components = (cinfo->quantize_colors ? 1 :
			      cinfo->out_color_components);

  /* See if upsampler will want to emit more than one row at a time */
  if (use_merged_upsample(cinfo))
    cinfo->rec_outbuf_height = cinfo->max_v_samp_factor;
  else
    cinfo->rec_outbuf_height = 1;
}